

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

HierarchicalInstanceSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::HierarchicalInstanceSyntax,slang::syntax::HierarchicalInstanceSyntax_const&>
          (BumpAllocator *this,HierarchicalInstanceSyntax *args)

{
  SyntaxNode *pSVar1;
  size_t sVar2;
  Info *pIVar3;
  undefined4 uVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  HierarchicalInstanceSyntax *pHVar9;
  
  pHVar9 = (HierarchicalInstanceSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((HierarchicalInstanceSyntax *)this->endPtr < pHVar9 + 1) {
    pHVar9 = (HierarchicalInstanceSyntax *)allocateSlow(this,0x78,8);
  }
  else {
    this->head->current = (byte *)(pHVar9 + 1);
  }
  (pHVar9->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar4 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pHVar9->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pHVar9->super_SyntaxNode).field_0x4 = uVar4;
  (pHVar9->super_SyntaxNode).parent = pSVar1;
  (pHVar9->openParen).info = (args->openParen).info;
  TVar5 = (args->openParen).kind;
  uVar6 = (args->openParen).field_0x2;
  NVar7.raw = (args->openParen).numFlags.raw;
  uVar8 = (args->openParen).rawLen;
  pHVar9->decl = args->decl;
  (pHVar9->openParen).kind = TVar5;
  (pHVar9->openParen).field_0x2 = uVar6;
  (pHVar9->openParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pHVar9->openParen).rawLen = uVar8;
  uVar4 = *(undefined4 *)&(args->connections).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->connections).super_SyntaxListBase.super_SyntaxNode.parent;
  (pHVar9->connections).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->connections).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pHVar9->connections).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar4;
  (pHVar9->connections).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pHVar9->connections).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->connections).super_SyntaxListBase.super_SyntaxNode.previewNode;
  (pHVar9->connections).super_SyntaxListBase.childCount =
       (args->connections).super_SyntaxListBase.childCount;
  (pHVar9->connections).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005b18f8;
  sVar2 = (args->connections).elements._M_extent._M_extent_value;
  (pHVar9->connections).elements._M_ptr = (args->connections).elements._M_ptr;
  (pHVar9->connections).elements._M_extent._M_extent_value = sVar2;
  uVar6 = (args->closeParen).field_0x2;
  NVar7.raw = (args->closeParen).numFlags.raw;
  uVar8 = (args->closeParen).rawLen;
  pIVar3 = (args->closeParen).info;
  (pHVar9->closeParen).kind = (args->closeParen).kind;
  (pHVar9->closeParen).field_0x2 = uVar6;
  (pHVar9->closeParen).numFlags = (NumericTokenFlags)NVar7.raw;
  (pHVar9->closeParen).rawLen = uVar8;
  (pHVar9->closeParen).info = pIVar3;
  return pHVar9;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }